

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O1

bool __thiscall fasttext::Autotune::quantize(Autotune *this,Args *args,Args *autotuneArgs)

{
  size_t sVar1;
  int iVar2;
  int64_t iVar3;
  int64_t fileSize;
  ostream *poVar4;
  bool bVar5;
  _Any_data local_48;
  code *pcStack_38;
  undefined8 uStack_30;
  
  iVar3 = Args::getAutotuneModelSize(autotuneArgs);
  bVar5 = true;
  if (iVar3 != -1) {
    FastText::getOutputMatrix((FastText *)&local_48);
    iVar3 = Matrix::size((Matrix *)local_48._M_unused._0_8_,0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
    args->qout = 0xff < iVar3;
    args->retrain = true;
    args->qnorm = true;
    sVar1 = args->dsub;
    fileSize = Args::getAutotuneModelSize(autotuneArgs);
    iVar2 = getCutoffForFileSize(this,0xff < iVar3,true,(int)sVar1,fileSize);
    args->cutoff = (long)iVar2;
    if (2 < autotuneArgs->verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cutoff = ",9);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    bVar5 = args->cutoff != 0x100;
    if (bVar5) {
      local_48._M_unused._M_object = (void *)0x0;
      local_48._8_8_ = 0;
      pcStack_38 = (code *)0x0;
      uStack_30 = 0;
      FastText::quantize((this->fastText_).
                         super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         args,(TrainCallback *)&local_48);
      if (pcStack_38 != (code *)0x0) {
        (*pcStack_38)(&local_48,&local_48,3);
      }
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool Autotune::quantize(Args& args, const Args& autotuneArgs) {
  if (autotuneArgs.getAutotuneModelSize() == Args::kUnlimitedModelSize) {
    return true;
  }
  auto outputSize = fastText_->getOutputMatrix()->size(0);

  args.qnorm = true;
  args.qout = (outputSize >= kCutoffLimit);
  args.retrain = true;
  args.cutoff = getCutoffForFileSize(
      args.qout, args.qnorm, args.dsub, autotuneArgs.getAutotuneModelSize());
  LOG_VAL(cutoff, args.cutoff);
  if (args.cutoff == kCutoffLimit) {
    return false;
  }
  fastText_->quantize(args);

  return true;
}